

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

int Nf_ManComputeArrival(Nf_Man_t *p,Nf_Mat_t *pM,int *pCutSet)

{
  uint uVar1;
  Mio_Cell2_t *pMVar2;
  uint *puVar3;
  Nf_Mat_t *pNVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  ulong uVar8;
  
  uVar1 = *(uint *)pM;
  pMVar2 = p->pCells;
  puVar3 = (uint *)Nf_CutFromHandle(pCutSet,uVar1 >> 0x14 & 0x3ff);
  if ((pM->field_0x3 & 0x40) != 0) {
    __assert_fail("!pM->fCompl",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                  ,0x730,"int Nf_ManComputeArrival(Nf_Man_t *, Nf_Mat_t *, int *)");
  }
  bVar7 = 0;
  uVar8 = 0;
  iVar6 = 0;
  while( true ) {
    if ((*puVar3 & 0x1f) <= uVar8) {
      return iVar6;
    }
    if (puVar3[(ulong)(((uint)pM->Cfg >> 8) >> (bVar7 & 0x1f) & 0xf) + 1] == 0) break;
    pNVar4 = Nf_ObjMatchBest(p,puVar3[(ulong)(((uint)pM->Cfg >> 8) >> (bVar7 & 0x1f) & 0xf) + 1],
                             (uint)((((uint)pM->Cfg >> 1 & 0x7f) >> ((uint)uVar8 & 0x1f) & 1) != 0))
    ;
    iVar5 = pMVar2[uVar1 & 0xfffff].iDelays[uVar8] + pNVar4->D;
    if (iVar6 <= iVar5) {
      iVar6 = iVar5;
    }
    uVar8 = uVar8 + 1;
    bVar7 = bVar7 + 4;
  }
  return iVar6;
}

Assistant:

int Nf_ManComputeArrival( Nf_Man_t * p, Nf_Mat_t * pM, int * pCutSet )
{
    int Delay = 0; 
    Nf_Mat_t * pMfan;
    int iVar, fCompl, k;
    Mio_Cell2_t * pCell = Nf_ManCell( p, pM->Gate );
    int * pCut = Nf_CutFromHandle( pCutSet, pM->CutH );
    assert( !pM->fCompl );
    Nf_CutForEachVarCompl( pCut, pM->Cfg, iVar, fCompl, k )
    {
        pMfan = Nf_ObjMatchBest( p, iVar, fCompl );
        Delay = Abc_MaxInt( Delay, pMfan->D + pCell->iDelays[k] );
    }
    //if ( pM->fCompl ) Delay += p->InvDelayI;
    return Delay;
}